

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

bool RigidBodyDynamics::isConstrainedSystemFullyActuated
               (Model *model,VectorNd *Q,VectorNd *QDot,ConstraintSet *CS,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Index IVar3;
  ConstraintSet *Tau;
  int local_60;
  void *local_58 [2];
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_48;
  undefined8 local_38;
  
  uVar1 = *(undefined8 *)(CS + 0x168);
  uVar2 = *(undefined8 *)(CS + 0x1f0);
  local_48.m_lhs =
       (LhsNested)
       (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_38 = 0;
  Tau = CS;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_58,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  CalcConstrainedSystemVariables(model,Q,QDot,(VectorNd *)Tau,CS,update_kinematics,f_ext);
  free(local_58[0]);
  local_48.m_lhs = (LhsNested)(CS + 0x198);
  local_48.m_rhs.m_matrix = (non_const_type)(CS + 0x200);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x470),&local_48);
  Eigen::FullPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(CS + 0x3c0),
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(CS + 0x470));
  IVar3 = Eigen::FullPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rank
                    ((FullPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(CS + 0x3c0)
                    );
  local_60 = (int)uVar2;
  return (int)uVar1 - local_60 == (int)IVar3;
}

Assistant:

RBDL_DLLAPI
bool isConstrainedSystemFullyActuated(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;


  assert (CS.S.cols()    == QDot.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;


  CalcConstrainedSystemVariables(model,Q,QDot,VectorNd::Zero(QDot.rows()),CS,
                                 update_kinematics, f_ext);

  CS.GPT = CS.G*CS.P.transpose();

  CS.GPT_full_qr.compute(CS.GPT);
  unsigned int r = unsigned(CS.GPT_full_qr.rank());

  bool isCompatible = false;
  if(r == (n-na)) {
    isCompatible = true;
  } else {
    isCompatible = false;
  }

  return isCompatible;

}